

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

wchar_t ma_itoa_s(wchar_t value,char *dst,size_t dstSizeInBytes,wchar_t radix)

{
  long lVar1;
  ulong uVar2;
  wchar_t wVar3;
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  
  if (dstSizeInBytes == 0 || dst == (char *)0x0) {
    return L'\x16';
  }
  if (0xffffffdc < (uint)(radix + L'\xffffffdb')) {
    uVar4 = (ulong)(uint)-value;
    if (L'\0' < value) {
      uVar4 = (ulong)(uint)value;
    }
    pcVar5 = dst;
    lVar7 = 0;
    do {
      wVar3 = (wchar_t)uVar4;
      uVar2 = uVar4 % (ulong)(uint)radix;
      cVar6 = '0';
      if (9 < (int)uVar2) {
        cVar6 = 'W';
      }
      *pcVar5 = cVar6 + (char)uVar2;
      pcVar5 = pcVar5 + 1;
      lVar1 = lVar7 + -1;
    } while ((1 - dstSizeInBytes != lVar7) &&
            (uVar4 = uVar4 / (uint)radix, lVar7 = lVar1, (uint)radix <= (uint)wVar3));
    if (dstSizeInBytes + lVar1 != 0) {
      if (value < L'\0' && radix == L'\n') {
        *pcVar5 = '-';
        if (1 - dstSizeInBytes == lVar1) goto LAB_001836a6;
        pcVar5 = dst + (1 - lVar1);
      }
      *pcVar5 = '\0';
      for (; pcVar5 = pcVar5 + -1, dst < pcVar5; dst = dst + 1) {
        cVar6 = *dst;
        *dst = *pcVar5;
        *pcVar5 = cVar6;
      }
      return L'\0';
    }
  }
LAB_001836a6:
  *dst = '\0';
  return L'\x16';
}

Assistant:

MA_API int ma_itoa_s(int value, char* dst, size_t dstSizeInBytes, int radix)
{
    int sign;
    unsigned int valueU;
    char* dstEnd;

    if (dst == NULL || dstSizeInBytes == 0) {
        return 22;
    }
    if (radix < 2 || radix > 36) {
        dst[0] = '\0';
        return 22;
    }

    sign = (value < 0 && radix == 10) ? -1 : 1;     /* The negative sign is only used when the base is 10. */

    if (value < 0) {
        valueU = -value;
    } else {
        valueU = value;
    }

    dstEnd = dst;
    do
    {
        int remainder = valueU % radix;
        if (remainder > 9) {
            *dstEnd = (char)((remainder - 10) + 'a');
        } else {
            *dstEnd = (char)(remainder + '0');
        }

        dstEnd += 1;
        dstSizeInBytes -= 1;
        valueU /= radix;
    } while (dstSizeInBytes > 0 && valueU > 0);

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    if (sign < 0) {
        *dstEnd++ = '-';
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    *dstEnd = '\0';


    /* At this point the string will be reversed. */
    dstEnd -= 1;
    while (dst < dstEnd) {
        char temp = *dst;
        *dst = *dstEnd;
        *dstEnd = temp;

        dst += 1;
        dstEnd -= 1;
    }

    return 0;
}